

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O2

int comparedUnsignedPair(void *a,void *b)

{
  if (*b <= *a) {
    if (*b < *a) {
      return 1;
    }
    if (*(uint *)((long)b + 4) <= *(uint *)((long)a + 4)) {
      return (int)(*(uint *)((long)b + 4) < *(uint *)((long)a + 4));
    }
  }
  return -1;
}

Assistant:

static int comparedUnsignedPair(const void* a, const void* b)
{
  const unsigned int* au = ((const unsigned int*)a);
  const unsigned int* bu = ((const unsigned int*)b);
  if (au[0] < bu[0])
    return -1;
  if (au[0] > bu[0])
    return 1;
  if (au[1] < bu[1])
    return -1;
  if (au[1] > bu[1])
    return 1;
  return 0;
}